

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

CK_RV __thiscall Token::getTokenInfo(Token *this,CK_TOKEN_INFO_PTR info)

{
  int iVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t sVar4;
  tm *__tp;
  CK_RV CVar5;
  MutexLocker lock;
  ByteString serial;
  ByteString label;
  time_t rawtime;
  char dateTime [17];
  char model [17];
  char mfgID [33];
  MutexLocker local_100;
  ByteString local_f0;
  ByteString local_c8;
  time_t local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  char local_78 [32];
  char local_58 [48];
  
  MutexLocker::MutexLocker(&local_100,this->tokenMutex);
  ByteString::ByteString(&local_c8);
  ByteString::ByteString(&local_f0);
  if (info == (CK_TOKEN_INFO_PTR)0x0) {
    CVar5 = 7;
  }
  else {
    builtin_memcpy(info->label,"                                ",0x20);
    builtin_memcpy(info->serialNumber,"                ",0x10);
    if (this->token == (ObjectStoreToken *)0x0) {
      info->flags = 0xc00025;
    }
    else {
      iVar1 = (*this->token->_vptr_ObjectStoreToken[4])();
      if ((char)iVar1 == '\0') {
        CVar5 = 5;
        softHSMLog(3,"getTokenInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x1e2,"Could not get the token flags");
        goto LAB_00172f07;
      }
      iVar1 = (*this->token->_vptr_ObjectStoreToken[6])(this->token,&local_c8);
      if ((char)iVar1 != '\0') {
        puVar2 = ByteString::byte_str(&local_c8);
        sVar3 = ByteString::size(&local_c8);
        strncpy((char *)info,(char *)puVar2,sVar3);
      }
      iVar1 = (*this->token->_vptr_ObjectStoreToken[7])(this->token,&local_f0);
      if ((char)iVar1 != '\0') {
        puVar2 = ByteString::byte_str(&local_f0);
        sVar3 = ByteString::size(&local_f0);
        strncpy((char *)info->serialNumber,(char *)puVar2,sVar3);
      }
    }
    builtin_strncpy(local_58,"SoftHSM project",0x10);
    builtin_strncpy(local_78,"SoftHSM v2",0xb);
    builtin_memcpy(info->model,"                ",0x10);
    builtin_memcpy(info->manufacturerID,"                                ",0x20);
    sVar4 = strlen(local_58);
    memcpy(info->manufacturerID,local_58,sVar4);
    sVar4 = strlen(local_78);
    memcpy(info->model,local_78,sVar4);
    info->ulSessionCount = 0xffffffffffffffff;
    info->ulRwSessionCount = 0xffffffffffffffff;
    CVar5 = 0;
    info->ulMaxRwSessionCount = 0;
    info->ulMaxSessionCount = 0;
    info->ulMaxPinLen = 0xff;
    info->ulMinPinLen = 4;
    *(undefined4 *)&info->ulTotalPublicMemory = 0xffffffff;
    *(undefined4 *)((long)&info->ulTotalPublicMemory + 4) = 0xffffffff;
    *(undefined4 *)&info->ulFreePublicMemory = 0xffffffff;
    *(undefined4 *)((long)&info->ulFreePublicMemory + 4) = 0xffffffff;
    *(undefined4 *)&info->ulTotalPrivateMemory = 0xffffffff;
    *(undefined4 *)((long)&info->ulTotalPrivateMemory + 4) = 0xffffffff;
    *(undefined4 *)&info->ulFreePrivateMemory = 0xffffffff;
    *(undefined4 *)((long)&info->ulFreePrivateMemory + 4) = 0xffffffff;
    (info->hardwareVersion).major = '\x02';
    (info->hardwareVersion).minor = '\x06';
    (info->firmwareVersion).major = '\x02';
    (info->firmwareVersion).minor = '\x06';
    time(&local_a0);
    __tp = gmtime(&local_a0);
    strftime((char *)&local_98,0x11,"%Y%m%d%H%M%S00",__tp);
    *(undefined8 *)info->utcTime = local_98;
    *(undefined8 *)(info->utcTime + 8) = uStack_90;
  }
LAB_00172f07:
  local_f0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_f0.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_c8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_c8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  MutexLocker::~MutexLocker(&local_100);
  return CVar5;
}

Assistant:

CK_RV Token::getTokenInfo(CK_TOKEN_INFO_PTR info)
{
	// Lock access to the token
	MutexLocker lock(tokenMutex);

	ByteString label, serial;

	if (info == NULL)
	{
		return CKR_ARGUMENTS_BAD;
	}

	memset(info->label, ' ', 32);
	memset(info->serialNumber, ' ', 16);

	// Token specific information
	if (token)
	{
		if (!token->getTokenFlags(info->flags))
		{
			ERROR_MSG("Could not get the token flags");
			return CKR_GENERAL_ERROR;
		}

		if (token->getTokenLabel(label))
		{
			strncpy((char*) info->label, (char*) label.byte_str(), label.size());
		}

		if (token->getTokenSerial(serial))
		{
			strncpy((char*) info->serialNumber, (char*) serial.byte_str(), serial.size());
		}
	}
	else
	{
		info->flags =	CKF_RNG |
				CKF_LOGIN_REQUIRED |
				CKF_RESTORE_KEY_NOT_NEEDED |
				CKF_SO_PIN_LOCKED |
				CKF_SO_PIN_TO_BE_CHANGED;
	}

	// Information shared by all tokens
	char mfgID[33];
	char model[17];

	snprintf(mfgID, 33, "SoftHSM project");
	snprintf(model, 17, "SoftHSM v2");

	memset(info->manufacturerID, ' ', 32);
	memset(info->model, ' ', 16);
	memcpy(info->manufacturerID, mfgID, strlen(mfgID));
	memcpy(info->model, model, strlen(model));

	// TODO: Can we set these?
	info->ulSessionCount = CK_UNAVAILABLE_INFORMATION;
	info->ulRwSessionCount = CK_UNAVAILABLE_INFORMATION;

	info->ulMaxRwSessionCount = CK_EFFECTIVELY_INFINITE;
	info->ulMaxSessionCount = CK_EFFECTIVELY_INFINITE;
	info->ulMaxPinLen = MAX_PIN_LEN;
	info->ulMinPinLen = MIN_PIN_LEN;
	info->ulTotalPublicMemory = CK_UNAVAILABLE_INFORMATION;
	info->ulFreePublicMemory = CK_UNAVAILABLE_INFORMATION;
	info->ulTotalPrivateMemory = CK_UNAVAILABLE_INFORMATION;
	info->ulFreePrivateMemory = CK_UNAVAILABLE_INFORMATION;
	info->hardwareVersion.major = VERSION_MAJOR;
	info->hardwareVersion.minor = VERSION_MINOR;
	info->firmwareVersion.major = VERSION_MAJOR;
	info->firmwareVersion.minor = VERSION_MINOR;

	// Current time
	time_t rawtime;
	time(&rawtime);
	char dateTime[17];
	strftime(dateTime, 17, "%Y%m%d%H%M%S00", gmtime(&rawtime));
	memcpy(info->utcTime, dateTime, 16);

		return CKR_OK;
}